

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O2

void __thiscall license::License::write_license(License *this)

{
  char cVar1;
  bool bVar2;
  SI_Error SVar3;
  runtime_error *prVar4;
  _Base_ptr p_Var5;
  TKeyVal *pTVar6;
  ostream *poVar7;
  to_upperF<char> in_RCX;
  _Alloc_hider Functor;
  _Self __tmp;
  pointer pbVar8;
  allocator local_609;
  long *local_608;
  undefined1 local_600 [8];
  path parentPath;
  ostream *local_5d8;
  undefined1 local_5d0 [8];
  path license_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  License *local_568;
  pointer local_560;
  pointer local_558;
  _Rb_tree_node_base *local_550;
  _Rb_tree_node_base *local_548;
  string feature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  is_any_ofF<char> local_500;
  string features;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_4c8;
  string license_for_sign;
  ifstream previous_license;
  ostream local_428 [16];
  _Alloc_hider local_418;
  ofstream license_stream;
  
  std::ofstream::ofstream(&license_stream);
  local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4c8.m_pData = (char *)0x0;
  local_4c8.m_uDataLen = 0;
  local_4c8.m_pFileComment = (char *)0x0;
  local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_4c8.m_strings;
  local_4c8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node._M_size._0_7_ = 0;
  local_4c8._95_4_ = 0;
  local_4c8.m_bSpaces = true;
  local_4c8.m_nOrder = 0;
  local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4c8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4c8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_4c8.m_strings.
       super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (this->m_license_fname == (string *)0x0) {
    local_5d8 = (ostream *)&std::cout;
  }
  else {
    std::ifstream::ifstream(&previous_license,(string *)this->m_license_fname,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__cxx11::string::string((string *)&license_name,(string *)this->m_license_fname);
      boost::filesystem::path::parent_path();
      if (parentPath.m_pathname._M_string_length != 0) {
        bVar2 = boost::filesystem::exists(&parentPath);
        if (bVar2) {
          bVar2 = boost::filesystem::is_regular_file(&parentPath);
          if (bVar2) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_588,"trying to create folder [",&parentPath.m_pathname);
            std::operator+(&local_520,&local_588,"] but there is a file with the same name. ");
            std::runtime_error::runtime_error(prVar4,(string *)&local_520);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          bVar2 = boost::filesystem::create_directories(&parentPath);
          if (!bVar2) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_588,"Cannot create licenses directory [",&parentPath.m_pathname);
            std::operator+(&local_520,&local_588,"]");
            std::runtime_error::runtime_error(prVar4,(string *)&local_520);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      std::__cxx11::string::~string((string *)&parentPath);
      std::__cxx11::string::~string((string *)&license_name);
    }
    else {
      SVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
                        (&local_4c8,(istream *)&previous_license);
      if (SVar3 != SI_OK) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,
                   "License file existing, but there were errors in loading it. Is it a license file?"
                  );
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_5d8 = (ostream *)&license_stream;
    std::ofstream::open((string *)local_5d8,(_Ios_Openmode)this->m_license_fname);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&parentPath.m_pathname,"Can not create file [",this->m_license_fname);
      std::operator+(&license_name.m_pathname,&parentPath.m_pathname,"].");
      std::runtime_error::runtime_error(prVar4,(string *)&license_name);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::~ifstream(&previous_license);
  }
  std::locale::locale((locale *)&previous_license);
  boost::algorithm::detail::
  transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_upperF<char>>
            (&features,(detail *)&this->m_feature_names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&previous_license,
             in_RCX);
  std::locale::~locale((locale *)&previous_license);
  feature_v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feature_v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feature_v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::algorithm::is_any_of<char[2]>(&local_500,(char (*) [2])",");
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&feature_v,&features,&local_500,token_compress_off);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_500);
  CryptoHelper::getInstance();
  (**(code **)(*local_608 + 0x18))(local_608,&this->m_private_key);
  local_560 = feature_v.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_550 = &(this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_568 = this;
  for (pbVar8 = feature_v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar8 != local_560; pbVar8 = pbVar8 + 1)
  {
    std::__cxx11::string::string((string *)&feature,(string *)pbVar8);
    Functor._M_p = (pointer)0xc8;
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
              (&local_4c8,feature._M_dataplus._M_p,"lic_ver",200,(char *)0x0,false,false);
    for (p_Var5 = (this->values_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 != local_550; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&previous_license,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(p_Var5 + 1));
      Functor._M_p = local_418._M_p;
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
                (&local_4c8,feature._M_dataplus._M_p,_previous_license,local_418._M_p,(char *)0x0,
                 false);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&previous_license);
    }
    pTVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSection
                       (&local_4c8,feature._M_dataplus._M_p);
    std::__cxx11::stringstream::stringstream((stringstream *)&previous_license);
    std::locale::locale((locale *)&parentPath.m_pathname);
    boost::algorithm::detail::
    transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_upperF<char>>
              (&license_name.m_pathname,(detail *)&feature,&parentPath.m_pathname,
               (to_upperF<char>)Functor._M_p);
    local_558 = pbVar8;
    std::operator<<(local_428,(string *)&license_name.m_pathname);
    std::__cxx11::string::~string((string *)&license_name.m_pathname);
    std::locale::~locale((locale *)&parentPath.m_pathname);
    local_548 = &(pTVar6->_M_t)._M_impl.super__Rb_tree_header._M_header;
    for (p_Var5 = (pTVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 != local_548; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::__cxx11::string::string
                ((string *)&license_name.m_pathname,*(char **)(p_Var5 + 1),
                 (allocator *)&parentPath.m_pathname);
      bVar2 = std::operator!=(&license_name.m_pathname,"sig");
      if (bVar2) {
        std::locale::locale((locale *)local_5d0);
        boost::algorithm::trim_copy<std::__cxx11::string>
                  (&parentPath.m_pathname,(algorithm *)&license_name.m_pathname,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                   (locale *)Functor._M_p);
        poVar7 = std::operator<<(local_428,(string *)&parentPath.m_pathname);
        std::__cxx11::string::string((string *)&local_588,(char *)p_Var5[1]._M_right,&local_609);
        std::locale::locale((locale *)local_600);
        boost::algorithm::trim_copy<std::__cxx11::string>
                  (&local_520,(algorithm *)&local_588,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600,
                   (locale *)Functor._M_p);
        std::operator<<(poVar7,(string *)&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        std::locale::~locale((locale *)local_600);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&parentPath.m_pathname);
        std::locale::~locale((locale *)local_5d0);
      }
      std::__cxx11::string::~string((string *)&license_name);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&previous_license);
    (**(code **)(*local_608 + 0x28))
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&previous_license,local_608,&license_for_sign);
    pbVar8 = local_558;
    this = local_568;
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
              (&local_4c8,feature._M_dataplus._M_p,"sig",_previous_license,(char *)0x0,false);
    std::__cxx11::string::~string((string *)&previous_license);
    std::__cxx11::string::~string((string *)&license_for_sign);
    std::__cxx11::string::~string((string *)&feature);
  }
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save(&local_4c8,local_5d8,true)
  ;
  if (local_608 != (long *)0x0) {
    (**(code **)(*local_608 + 0x38))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&feature_v);
  std::__cxx11::string::~string((string *)&features);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl(&local_4c8);
  std::ofstream::~ofstream(&license_stream);
  return;
}

Assistant:

void License::write_license() {
	ofstream license_stream;
	ostream *output_license;
	CSimpleIniA ini;
	if (m_license_fname == nullptr) {
		output_license = &cout;
	} else {
		ifstream previous_license(*m_license_fname);
		if (previous_license.is_open()) {
			SI_Error error = ini.LoadData(previous_license);
			if (error != SI_Error::SI_OK) {
				throw runtime_error(
					"License file existing, but there were errors in loading it. Is it a license file?");
			}
		} else {
			// new license
			create_license_path(*m_license_fname);
		}
		output_license = &license_stream;
		license_stream.open(*m_license_fname, ios::trunc | ios::binary);
		if (!license_stream.is_open()) {
			throw runtime_error("Can not create file [" + *m_license_fname + "].");
		}
	}

	const string features = boost::to_upper_copy(m_feature_names);
	vector<string> feature_v;
	boost::algorithm::split(feature_v, features, boost::is_any_of(","));
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->loadPrivateKey_file(m_private_key);

	for (const string feature : feature_v) {
		ini.SetLongValue(feature.c_str(), "lic_ver", LICENSE_FILE_VERSION);
		for (auto it : values_map) {
			ini.SetValue(feature.c_str(), it.first.c_str(), it.second.c_str());
		}
		const CSimpleIniA::TKeyVal *section = ini.GetSection(feature.c_str());
		string license_for_sign = print_for_sign(feature, section);
		const string signature = crypto->signString(license_for_sign);
		ini.SetValue(feature.c_str(), LICENSE_SIGNATURE, signature.c_str());
	}
	ini.Save(*output_license, true);
}